

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Info.cpp
# Opt level: O0

void curlpp::
     InfoTypeConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ::get(Easy *handle,CURLINFO info,string *value)

{
  string *in_RDX;
  char *tmp;
  CURLINFO in_stack_ffffffffffffffdc;
  Easy *in_stack_ffffffffffffffe0;
  
  InfoGetter::get<char*>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,(char **)0x1485f5);
  std::__cxx11::string::operator=(in_RDX,(char *)in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void
InfoTypeConverter<std::string>::get(const curlpp::Easy & handle, 
				      CURLINFO info,
				      std::string & value)
{
  char * tmp;
  InfoGetter::get(handle, info, tmp);
  value = tmp;
}